

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::
map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
::erase(map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
        *this,iterator *pos)

{
  bool bVar1;
  undefined8 uVar2;
  iterator *in_RSI;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  *in_RDI;
  undefined3 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffd4;
  Node *in_stack_ffffffffffffffd8;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  *in_stack_ffffffffffffffe0;
  
  uVar3 = CONCAT13(1,in_stack_ffffffffffffffd0);
  if (in_RSI->cor == in_RDI) {
    end(in_RDI);
    bVar1 = iterator::operator==(in_RSI,(iterator *)&stack0xffffffffffffffe0);
    uVar3 = CONCAT13(bVar1,(int3)uVar3);
  }
  if ((char)((uint)uVar3 >> 0x18) == '\0') {
    erase(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x68);
  runtime_error::runtime_error((runtime_error *)CONCAT44(in_stack_ffffffffffffffd4,uVar3));
  __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void erase(iterator pos)
	{
		if (pos.cor != this || pos == end()) throw(runtime_error());
		erase(pos.ptr);
	}